

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * cuddZddWeakDivF(DdManager *dd,DdNode *f,DdNode *g)

{
  int iVar1;
  int id;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *n_00;
  int local_c0;
  int nv;
  int pv;
  int flag;
  DdNode *termd;
  DdNode *term0;
  DdNode *term1;
  DdNode *r;
  DdNode *tmp;
  DdNode *q;
  DdNode *gd;
  DdNode *g1;
  DdNode *g0;
  DdNode *fd;
  DdNode *f1;
  DdNode *f0;
  DdNode *zero;
  DdNode *one;
  int local_38;
  int vg;
  int vf;
  int top_g;
  int top_f;
  int v;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  zero = dd->one;
  f0 = dd->zero;
  dd_local = (DdManager *)f;
  if ((((g != zero) && (dd_local = (DdManager *)f0, f != f0)) && (f != zero)) &&
     ((dd_local = (DdManager *)zero, f != g &&
      (_top_f = g, g_local = f, f_local = &dd->sentinel,
      dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,cuddZddWeakDivF,f,g),
      dd_local == (DdManager *)0x0)))) {
    vf = *(int *)(*(long *)(f_local + 8) + (ulong)g_local->index * 4);
    vg = *(int *)(*(long *)(f_local + 8) + (ulong)_top_f->index * 4);
    local_38 = vf >> 1;
    one._4_4_ = vg >> 1;
    local_c0 = vf;
    if (vg < vf) {
      local_c0 = vg;
    }
    if ((local_c0 == vf) && (local_38 < one._4_4_)) {
      top_g = g_local->index;
      iVar1 = cuddZddGetCofactors3((DdManager *)f_local,g_local,top_g,&fd,&f1,&g0);
      if (iVar1 == 1) {
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(fd);
        Cudd_Ref(f1);
        Cudd_Ref(g0);
        iVar1 = cuddZddGetPosVarIndex((DdManager *)f_local,top_g);
        id = cuddZddGetNegVarIndex((DdManager *)f_local,top_g);
        pDVar2 = cuddZddWeakDivF((DdManager *)f_local,fd,_top_f);
        if (pDVar2 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(pDVar2);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
          pDVar3 = cuddZddWeakDivF((DdManager *)f_local,f1,_top_f);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(pDVar3);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
            n = cuddZddWeakDivF((DdManager *)f_local,g0,_top_f);
            if (n == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar3);
              dd_local = (DdManager *)0x0;
            }
            else {
              Cudd_Ref(n);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              n_00 = cuddZddGetNode((DdManager *)f_local,id,pDVar3,n);
              if (n_00 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar3);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,n);
                dd_local = (DdManager *)0x0;
              }
              else {
                Cudd_Ref(n_00);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar3);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,n);
                dd_local = (DdManager *)cuddZddGetNode((DdManager *)f_local,iVar1,pDVar2,n_00);
                if (dd_local == (DdManager *)0x0) {
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  Cudd_Ref((DdNode *)dd_local);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                  cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDivF,g_local,_top_f,
                                   (DdNode *)dd_local);
                  Cudd_Deref((DdNode *)dd_local);
                }
              }
            }
          }
        }
      }
    }
    else {
      if (local_c0 == vf) {
        top_g = g_local->index;
      }
      else {
        top_g = _top_f->index;
      }
      iVar1 = cuddZddGetCofactors3((DdManager *)f_local,g_local,top_g,&fd,&f1,&g0);
      if (iVar1 == 1) {
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(fd);
        Cudd_Ref(f1);
        Cudd_Ref(g0);
        iVar1 = cuddZddGetCofactors3((DdManager *)f_local,_top_f,top_g,&gd,&g1,&q);
        if (iVar1 == 1) {
          Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(gd);
          Cudd_Ref(g1);
          Cudd_Ref(q);
          tmp = _top_f;
          if (g1 == f0) {
            Cudd_Ref(_top_f);
          }
          else {
            tmp = cuddZddWeakDivF((DdManager *)f_local,f1,g1);
            if (tmp == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              return (DdNode *)0x0;
            }
            Cudd_Ref(tmp);
          }
          Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
          if (tmp == f0) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
            cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDivF,g_local,_top_f,f0);
            Cudd_Deref(tmp);
            dd_local = (DdManager *)f0;
          }
          else {
            if (gd == f0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
              pDVar2 = tmp;
            }
            else {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,tmp);
              pDVar2 = cuddZddWeakDivF((DdManager *)f_local,fd,gd);
              if (pDVar2 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                return (DdNode *)0x0;
              }
              Cudd_Ref(pDVar2);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
              if (tmp != _top_f) {
                pDVar3 = cuddZddIntersect((DdManager *)f_local,tmp,pDVar2);
                if (pDVar3 == (DdNode *)0x0) {
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                  return (DdNode *)0x0;
                }
                Cudd_Ref(pDVar3);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                pDVar2 = pDVar3;
              }
            }
            tmp = pDVar2;
            if (tmp == f0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDivF,g_local,_top_f,f0);
              Cudd_Deref(tmp);
              dd_local = (DdManager *)f0;
            }
            else {
              if (q == f0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                pDVar2 = tmp;
              }
              else {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,tmp);
                pDVar2 = cuddZddWeakDivF((DdManager *)f_local,g0,q);
                if (pDVar2 == (DdNode *)0x0) {
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                  return (DdNode *)0x0;
                }
                Cudd_Ref(pDVar2);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                if (tmp != _top_f) {
                  pDVar3 = cuddZddIntersect((DdManager *)f_local,tmp,pDVar2);
                  if (pDVar3 == (DdNode *)0x0) {
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                    return (DdNode *)0x0;
                  }
                  Cudd_Ref(pDVar3);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                  pDVar2 = pDVar3;
                }
              }
              tmp = pDVar2;
              cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDivF,g_local,_top_f,tmp);
              Cudd_Deref(tmp);
              dd_local = (DdManager *)tmp;
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddWeakDivF(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g, vf, vg;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *q, *tmp;
    DdNode      *r;
    DdNode      *term1, *term0, *termd;
    int         flag;
    int         pv, nv;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddWeakDivF, f, g);
    if (r)
        return(r);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];
    vf = top_f >> 1;
    vg = top_g >> 1;
    v = ddMin(top_f, top_g);

    if (v == top_f && vf < vg) {
        v = f->index;
        flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
        if (flag == 1)
            return(NULL);
        Cudd_Ref(f1);
        Cudd_Ref(f0);
        Cudd_Ref(fd);

        pv = cuddZddGetPosVarIndex(dd, v);
        nv = cuddZddGetNegVarIndex(dd, v);

        term1 = cuddZddWeakDivF(dd, f1, g);
        if (term1 == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            return(NULL);
        }
        Cudd_Ref(term1);
        Cudd_RecursiveDerefZdd(dd, f1);
        term0 = cuddZddWeakDivF(dd, f0, g);
        if (term0 == NULL) {
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, term1);
            return(NULL);
        }
        Cudd_Ref(term0);
        Cudd_RecursiveDerefZdd(dd, f0);
        termd = cuddZddWeakDivF(dd, fd, g);
        if (termd == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, term0);
            return(NULL);
        }
        Cudd_Ref(termd);
        Cudd_RecursiveDerefZdd(dd, fd);

        tmp = cuddZddGetNode(dd, nv, term0, termd); /* nv = zi */
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, term0);
            Cudd_RecursiveDerefZdd(dd, termd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, term0);
        Cudd_RecursiveDerefZdd(dd, termd);
        q = cuddZddGetNode(dd, pv, term1, tmp); /* pv = yi */
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, tmp);
            return(NULL);
        }
        Cudd_Ref(q);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, tmp);

        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, q);
        Cudd_Deref(q);
        return(q);
    }

    if (v == top_f)
        v = f->index;
    else
        v = g->index;

    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);

    q = g;

    if (g0 != zero) {
        q = cuddZddWeakDivF(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(q);
    }
    else
        Cudd_Ref(q);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (g1 != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDivF(dd, f1, g1);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, fd);
                Cudd_RecursiveDerefZdd(dd, gd);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
    }

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (gd != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDivF(dd, fd, gd);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, tmp);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
    }

    cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, q);
    Cudd_Deref(q);
    return(q);

}